

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_reflection.cc
# Opt level: O1

void __thiscall
google::protobuf::internal::GeneratedMessageReflection::SwapElements
          (GeneratedMessageReflection *this,Message *message,FieldDescriptor *field,int index1,
          int index2)

{
  undefined8 uVar1;
  undefined1 uVar2;
  undefined4 uVar3;
  long lVar4;
  void *pvVar5;
  bool bVar6;
  uint32 uVar7;
  Type TVar8;
  RepeatedPtrFieldBase *pRVar9;
  Rep *pRVar10;
  MapFieldBase *this_00;
  
  if (*(Descriptor **)(field + 0x58) != this->descriptor_) {
    anon_unknown_0::ReportReflectionUsageError
              (this->descriptor_,field,"Swap","Field does not match message type.");
  }
  if (*(int *)(field + 0x4c) != 3) {
    anon_unknown_0::ReportReflectionUsageError
              (this->descriptor_,field,"Swap",
               "Field is singular; the method requires a repeated field.");
  }
  if (field[0x50] == (FieldDescriptor)0x1) {
    uVar7 = ReflectionSchema::GetExtensionSetOffset(&this->schema_);
    ExtensionSet::SwapElements
              ((ExtensionSet *)
               ((long)&(message->super_MessageLite)._vptr_MessageLite + (ulong)uVar7),
               *(int *)(field + 0x38),index1,index2);
    return;
  }
  TVar8 = FieldDescriptor::type(field);
  switch(*(undefined4 *)(FieldDescriptor::kTypeToCppTypeMap + (ulong)TVar8 * 4)) {
  case 1:
  case 3:
  case 8:
    uVar7 = ReflectionSchema::GetFieldOffset(&this->schema_,field);
    lVar4 = *(long *)((long)&message[1].super_MessageLite._vptr_MessageLite + (ulong)uVar7);
    uVar3 = *(undefined4 *)(lVar4 + 8 + (long)index1 * 4);
    *(undefined4 *)(lVar4 + 8 + (long)index1 * 4) = *(undefined4 *)(lVar4 + 8 + (long)index2 * 4);
    *(undefined4 *)(lVar4 + 8 + (long)index2 * 4) = uVar3;
    break;
  case 2:
  case 4:
    uVar7 = ReflectionSchema::GetFieldOffset(&this->schema_,field);
    pRVar10 = *(Rep **)((long)&message[1].super_MessageLite._vptr_MessageLite + (ulong)uVar7);
    goto LAB_00319b8a;
  case 5:
    uVar7 = ReflectionSchema::GetFieldOffset(&this->schema_,field);
    lVar4 = *(long *)((long)&message[1].super_MessageLite._vptr_MessageLite + (ulong)uVar7);
    uVar1 = *(undefined8 *)(lVar4 + 8 + (long)index1 * 8);
    *(undefined8 *)(lVar4 + 8 + (long)index1 * 8) = *(undefined8 *)(lVar4 + 8 + (long)index2 * 8);
    *(undefined8 *)(lVar4 + 8 + (long)index2 * 8) = uVar1;
    break;
  case 6:
    uVar7 = ReflectionSchema::GetFieldOffset(&this->schema_,field);
    lVar4 = *(long *)((long)&message[1].super_MessageLite._vptr_MessageLite + (ulong)uVar7);
    uVar3 = *(undefined4 *)(lVar4 + 8 + (long)index1 * 4);
    *(undefined4 *)(lVar4 + 8 + (long)index1 * 4) = *(undefined4 *)(lVar4 + 8 + (long)index2 * 4);
    *(undefined4 *)(lVar4 + 8 + (long)index2 * 4) = uVar3;
    break;
  case 7:
    uVar7 = ReflectionSchema::GetFieldOffset(&this->schema_,field);
    lVar4 = *(long *)((long)&message[1].super_MessageLite._vptr_MessageLite + (ulong)uVar7);
    uVar2 = *(undefined1 *)(lVar4 + 8 + (long)index1);
    *(undefined1 *)(lVar4 + 8 + (long)index1) = *(undefined1 *)(lVar4 + 8 + (long)index2);
    *(undefined1 *)(lVar4 + 8 + (long)index2) = uVar2;
    break;
  case 9:
  case 10:
    bVar6 = FieldDescriptor::is_map(field);
    uVar7 = ReflectionSchema::GetFieldOffset(&this->schema_,field);
    this_00 = (MapFieldBase *)((long)&(message->super_MessageLite)._vptr_MessageLite + (ulong)uVar7)
    ;
    if (bVar6) {
      pRVar9 = MapFieldBase::MutableRepeatedField(this_00);
      pRVar10 = pRVar9->rep_;
    }
    else {
      pRVar10 = (Rep *)this_00->repeated_field_;
    }
LAB_00319b8a:
    pvVar5 = pRVar10->elements[index1];
    pRVar10->elements[index1] = pRVar10->elements[index2];
    pRVar10->elements[index2] = pvVar5;
  }
  return;
}

Assistant:

void GeneratedMessageReflection::SwapElements(
    Message* message,
    const FieldDescriptor* field,
    int index1,
    int index2) const {
  USAGE_CHECK_MESSAGE_TYPE(Swap);
  USAGE_CHECK_REPEATED(Swap);

  if (field->is_extension()) {
    MutableExtensionSet(message)->SwapElements(field->number(), index1, index2);
  } else {
    switch (field->cpp_type()) {
#define HANDLE_TYPE(UPPERCASE, LOWERCASE)                                     \
      case FieldDescriptor::CPPTYPE_##UPPERCASE :                             \
        MutableRaw<RepeatedField<LOWERCASE> >(message, field)                 \
            ->SwapElements(index1, index2);                                   \
        break

      HANDLE_TYPE( INT32,  int32);
      HANDLE_TYPE( INT64,  int64);
      HANDLE_TYPE(UINT32, uint32);
      HANDLE_TYPE(UINT64, uint64);
      HANDLE_TYPE(DOUBLE, double);
      HANDLE_TYPE( FLOAT,  float);
      HANDLE_TYPE(  BOOL,   bool);
      HANDLE_TYPE(  ENUM,    int);
#undef HANDLE_TYPE

      case FieldDescriptor::CPPTYPE_STRING:
      case FieldDescriptor::CPPTYPE_MESSAGE:
        if (IsMapFieldInApi(field)) {
          MutableRaw<MapFieldBase>(message, field)
              ->MutableRepeatedField()
              ->SwapElements(index1, index2);
        } else {
          MutableRaw<RepeatedPtrFieldBase>(message, field)
            ->SwapElements(index1, index2);
        }
        break;
    }
  }
}